

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O1

void ngx_http_writer(ngx_http_request_t *r)

{
  ngx_connection_t *pnVar1;
  ngx_event_t *ev;
  void *pvVar2;
  ngx_int_t nVar3;
  
  pnVar1 = r->connection;
  ev = pnVar1->write;
  if ((ev->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,ev->log,0,"http writer handler: \"%V?%V\"",&r->uri,&r->args);
  }
  if ((*(uint *)&ev->field_0x8 >> 10 & 1) == 0) {
    pvVar2 = r->main->loc_conf[ngx_http_core_module.ctx_index];
    if (((*(uint *)&ev->field_0x8 >> 0xc & 1) != 0) || ((r->field_0x464 & 1) != 0)) {
      if ((ev->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,ev->log,0,"http writer delayed");
      }
LAB_00143dc2:
      if ((ev->field_0x9 & 0x10) == 0) {
        ngx_event_add_timer(ev,*(ngx_msec_t *)((long)pvVar2 + 0x108));
      }
      nVar3 = ngx_handle_write_event(ev,*(size_t *)((long)pvVar2 + 0xd0));
      if (nVar3 == 0) {
        return;
      }
      ngx_http_close_request(r,0);
      return;
    }
    nVar3 = ngx_http_output_filter(r,(ngx_chain_t *)0x0);
    if ((pnVar1->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar1->log,0,"http writer output filter: %i, \"%V?%V\"",nVar3,&r->uri,
                         &r->args);
    }
    if (nVar3 == -1) {
      nVar3 = -1;
    }
    else {
      if ((((r->field_0x46b & 0x1e) != 0) || (r->postponed != (ngx_http_postponed_request_t *)0x0))
         || ((r->main == r && (pnVar1->field_0xd8 != '\0')))) goto LAB_00143dc2;
      if ((ev->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,ev->log,0,"http writer done: \"%V?%V\"",&r->uri,&r->args);
      }
      r->write_event_handler = ngx_http_request_empty_handler;
    }
  }
  else {
    if (6 < pnVar1->log->log_level) {
      ngx_log_error_core(7,pnVar1->log,0x6e,"client timed out");
    }
    pnVar1->field_0xd9 = pnVar1->field_0xd9 | 8;
    nVar3 = 0x198;
  }
  ngx_http_finalize_request(r,nVar3);
  return;
}

Assistant:

static void
ngx_http_writer(ngx_http_request_t *r)
{
    ngx_int_t                  rc;
    ngx_event_t               *wev;
    ngx_connection_t          *c;
    ngx_http_core_loc_conf_t  *clcf;

    c = r->connection;
    wev = c->write;

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, wev->log, 0,
                   "http writer handler: \"%V?%V\"", &r->uri, &r->args);

    clcf = ngx_http_get_module_loc_conf(r->main, ngx_http_core_module);

    if (wev->timedout) {
        ngx_log_error(NGX_LOG_INFO, c->log, NGX_ETIMEDOUT,
                      "client timed out");
        c->timedout = 1;

        ngx_http_finalize_request(r, NGX_HTTP_REQUEST_TIME_OUT);
        return;
    }

    if (wev->delayed || r->aio) {
        ngx_log_debug0(NGX_LOG_DEBUG_HTTP, wev->log, 0,
                       "http writer delayed");

        if (!wev->delayed) {
            ngx_add_timer(wev, clcf->send_timeout);
        }

        if (ngx_handle_write_event(wev, clcf->send_lowat) != NGX_OK) {
            ngx_http_close_request(r, 0);
        }

        return;
    }

    rc = ngx_http_output_filter(r, NULL);

    ngx_log_debug3(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http writer output filter: %i, \"%V?%V\"",
                   rc, &r->uri, &r->args);

    if (rc == NGX_ERROR) {
        ngx_http_finalize_request(r, rc);
        return;
    }

    if (r->buffered || r->postponed || (r == r->main && c->buffered)) {

        if (!wev->delayed) {
            ngx_add_timer(wev, clcf->send_timeout);
        }

        if (ngx_handle_write_event(wev, clcf->send_lowat) != NGX_OK) {
            ngx_http_close_request(r, 0);
        }

        return;
    }

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, wev->log, 0,
                   "http writer done: \"%V?%V\"", &r->uri, &r->args);

    r->write_event_handler = ngx_http_request_empty_handler;

    ngx_http_finalize_request(r, rc);
}